

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O0

void __thiscall ThreadedImageSaver::~ThreadedImageSaver(ThreadedImageSaver *this)

{
  bool bVar1;
  iterator this_00;
  mutex_type *in_RDI;
  thread *thread;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  *in_stack_ffffffffffffffd0;
  
  in_RDI[3].super___mutex_base._M_mutex.__size[0x10] = '\x01';
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffd0,in_RDI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x133e73);
  std::condition_variable::notify_all();
  this_00 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                      ((vector<std::thread,_std::allocator<std::thread>_> *)in_RDI);
  std::vector<std::thread,_std::allocator<std::thread>_>::end
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
          *)__gnu_cxx::
            __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
            ::operator*((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                         *)&stack0xffffffffffffffe0);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                *)&stack0xffffffffffffffe0);
  }
  std::condition_variable::~condition_variable
            ((condition_variable *)(in_RDI[1].super___mutex_base._M_mutex.__size + 8));
  std::
  vector<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
  ::~vector((vector<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
             *)this_00._M_current);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)this_00._M_current);
  return;
}

Assistant:

ThreadedImageSaver::~ThreadedImageSaver() {
	stopped = true;
	(void)std::lock_guard<std::mutex>(mtx);
	cv.notify_all();
	for (auto& thread : threads) {
		thread.join();
	}
}